

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryDefaultState::iterate
          (TransformFeedbackOverflowQueryDefaultState *this)

{
  bool bVar1;
  GLuint GVar2;
  TestError *pTVar3;
  uint local_20;
  GLuint i;
  TransformFeedbackOverflowQueryDefaultState *this_local;
  
  bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                    (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ec,0,0);
  if (!bVar1) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,
               "Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is non-zero"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0xfb);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    for (local_20 = 0;
        GVar2 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                          ((TransformFeedbackOverflowQueryBaseTest *)this), local_20 < GVar2;
        local_20 = local_20 + 1) {
      bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                        (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,0,0);
      if (!bVar1) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,
                   "Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is non-zero"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                   ,0x105);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryContextStateBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, 0))
		{
			TCU_FAIL("Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is non-zero");
		}

		if (supportsTransformFeedback3())
		{
			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, 0, 0))
				{
					TCU_FAIL("Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
							 "is non-zero");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}